

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cc
# Opt level: O1

int TVMBackendParallelLaunch(FTVMParallelLambda flambda,void *cdata,int num_task)

{
  int iVar1;
  TVMParallelGroupEnv *penv;
  int i;
  int iVar2;
  uint uVar3;
  TVMParallelGroupEnv penv_;
  TVMParallelGroupEnv local_38;
  
  local_38.num_task = 1;
  if (1 < num_task) {
    local_38.num_task = num_task;
  }
  local_38.sync_handle = (void *)0x0;
  iVar2 = 0;
  uVar3 = 0;
  do {
    iVar1 = (*flambda)(iVar2,&local_38,cdata);
    uVar3 = uVar3 | -(uint)(iVar1 != 0);
    iVar2 = iVar2 + 1;
  } while (iVar2 < local_38.num_task);
  return uVar3;
}

Assistant:

int TVMBackendParallelLaunch(
    FTVMParallelLambda flambda,
    void *cdata,
    int num_task) {

  /* [RISCV-DLR] use the master thread to run all tasks */
#ifdef DEBUG_DLR
  printf("[ParallelLaunch] num task : %d\n", num_task);
#endif
  TVMParallelGroupEnv penv_;
  TVMParallelGroupEnv *penv = &penv_;
  penv_.num_task = std::max(num_task, 1);
  penv_.sync_handle = nullptr;

  int res = 0;
#ifdef DEBUG_DLR
  printf("[ParallelLaunch] run task : ");
#endif
  for (int i = 0; i < penv_.num_task; i++) {
    if ((*flambda)(i, penv, cdata) == 0) {
      /* 0,1,2 ...*/
#ifdef DEBUG_DLR
      printf("%d\b", i);
      fflush(stdout);
#endif
    } else
      res = -1;
#ifdef DEBUG_DLR
    printf("\n");
#endif
  }
  return res;

  /*
  int res = tvm::runtime::ThreadPool::ThreadLocal()->Launch(
      flambda, cdata, num_task, 1);

    return res;
*/
}